

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaCommand.cxx
# Opt level: O1

void __thiscall MetaCommand::MetaCommand(MetaCommand *this)

{
  (this->m_Version)._M_dataplus._M_p = (pointer)&(this->m_Version).field_2;
  (this->m_Version)._M_string_length = 0;
  (this->m_Version).field_2._M_local_buf[0] = '\0';
  (this->m_Date)._M_dataplus._M_p = (pointer)&(this->m_Date).field_2;
  (this->m_Date)._M_string_length = 0;
  (this->m_Date).field_2._M_local_buf[0] = '\0';
  (this->m_Name)._M_dataplus._M_p = (pointer)&(this->m_Name).field_2;
  (this->m_Name)._M_string_length = 0;
  (this->m_Name).field_2._M_local_buf[0] = '\0';
  (this->m_Description)._M_dataplus._M_p = (pointer)&(this->m_Description).field_2;
  (this->m_Description)._M_string_length = 0;
  (this->m_Description).field_2._M_local_buf[0] = '\0';
  (this->m_Author)._M_dataplus._M_p = (pointer)&(this->m_Author).field_2;
  (this->m_Author)._M_string_length = 0;
  (this->m_Author).field_2._M_local_buf[0] = '\0';
  (this->m_ExecutableName)._M_dataplus._M_p = (pointer)&(this->m_ExecutableName).field_2;
  (this->m_ExecutableName)._M_string_length = 0;
  (this->m_ExecutableName).field_2._M_local_buf[0] = '\0';
  this->m_HelpCallBack = (_func_void *)0x0;
  (this->m_OptionVector).
  super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_OptionVector).
  super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_OptionVector).
  super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_ParsedOptionVector).
  super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_ParsedOptionVector).
  super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_ParsedOptionVector).
  super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::_M_erase_at_end
            (&this->m_OptionVector,(pointer)0x0);
  std::__cxx11::string::_M_replace
            ((ulong)this,0,(char *)(this->m_Version)._M_string_length,0x16a700);
  std::__cxx11::string::_M_replace
            ((ulong)&this->m_Date,0,(char *)(this->m_Date)._M_string_length,0x16a700);
  std::__cxx11::string::_M_replace
            ((ulong)&this->m_Name,0,(char *)(this->m_Name)._M_string_length,0x16b513);
  std::__cxx11::string::_M_replace
            ((ulong)&this->m_Author,0,(char *)(this->m_Author)._M_string_length,0x16a700);
  std::__cxx11::string::_M_replace
            ((ulong)&this->m_Description,0,(char *)(this->m_Description)._M_string_length,0x16b513);
  std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::_M_erase_at_end
            (&this->m_ParsedOptionVector,
             (this->m_ParsedOptionVector).
             super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>._M_impl.
             super__Vector_impl_data._M_start);
  this->m_Verbose = true;
  return;
}

Assistant:

MetaCommand::MetaCommand()
{
  m_HelpCallBack = nullptr;
  m_OptionVector.clear();
  m_Version = "Not defined";
  m_Date = "Not defined";
  m_Name = "";
  m_Author = "Not defined";
  m_Description = "";
  m_ParsedOptionVector.clear();
  m_Verbose = true;
}